

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O0

void Abc_SclPrintBuffersOne(SC_Man *p,Abc_Obj_t *pObj,int nOffset)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  SC_Cell *pSVar6;
  float fVar7;
  float fVar8;
  double dVar9;
  double dVar10;
  float local_44;
  char *local_30;
  int local_20;
  int i;
  int nOffset_local;
  Abc_Obj_t *pObj_local;
  SC_Man *p_local;
  
  for (local_20 = 0; local_20 < nOffset; local_20 = local_20 + 1) {
    printf("    ");
  }
  uVar1 = Abc_ObjId(pObj);
  iVar2 = Abc_ObjIsPi(pObj);
  if (iVar2 == 0) {
    local_30 = Mio_GateReadName((Mio_Gate_t *)(pObj->field_5).pData);
  }
  else {
    local_30 = "pi";
  }
  uVar3 = Abc_ObjFanoutNum(pObj);
  uVar4 = Abc_SclCountBufferFanouts(pObj);
  uVar5 = Abc_SclCountNonBufferFanouts(pObj);
  printf("%6d: %-16s (%2d:%3d:%3d)  ",(ulong)uVar1,local_30,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5);
  for (; local_20 < 4; local_20 = local_20 + 1) {
    printf("    ");
  }
  iVar2 = Abc_ObjIsPi(pObj);
  if (iVar2 == 0) {
    pSVar6 = Abc_SclObjCell(pObj);
    local_44 = pSVar6->area;
  }
  else {
    local_44 = 0.0;
  }
  printf("a =%5.2f  ",(double)local_44);
  printf("d = (");
  Abc_SclObjTimeOne(p,pObj,1);
  printf("%6.0f ps; ");
  Abc_SclObjTimeOne(p,pObj,0);
  printf("%6.0f ps)  ");
  Abc_SclObjLoadMax(p,pObj);
  printf("l =%5.0f ff  ");
  Abc_SclObjSlewMax(p,pObj);
  printf("s =%5.0f ps   ");
  Abc_SclObjSlackMax(p,pObj,p->MaxDelay0);
  printf("sl =%5.0f ps   ");
  if (nOffset == 0) {
    fVar7 = Abc_SclCountNonBufferLoad(p,pObj);
    printf("L =%5.0f ff   ",(double)fVar7);
    fVar7 = Abc_SclCountNonBufferLoad(p,pObj);
    printf("Lx =%5.0f ff  ",((double)fVar7 * 100.0) / (double)p->EstLoadAve);
    fVar7 = Abc_SclCountNonBufferDelay(p,pObj);
    iVar2 = Abc_SclCountNonBufferFanouts(pObj);
    dVar9 = Abc_SclObjTimeOne(p,pObj,1);
    printf("Dx =%5.0f ps  ",(double)(fVar7 / (float)iVar2) - dVar9);
    fVar7 = Abc_SclCountNonBufferDelay(p,pObj);
    iVar2 = Abc_SclCountNonBufferFanouts(pObj);
    dVar9 = Abc_SclObjTimeOne(p,pObj,1);
    fVar8 = Abc_SclCountNonBufferLoad(p,pObj);
    dVar10 = log((double)(fVar8 / p->EstLoadAve));
    printf("Cx =%5.0f ps",((double)(fVar7 / (float)iVar2) - dVar9) / dVar10);
  }
  printf("\n");
  return;
}

Assistant:

void Abc_SclPrintBuffersOne( SC_Man * p, Abc_Obj_t * pObj, int nOffset )
{
    int i;
    for ( i = 0; i < nOffset; i++ )
        printf( "    " );
    printf( "%6d: %-16s (%2d:%3d:%3d)  ", 
        Abc_ObjId(pObj), 
        Abc_ObjIsPi(pObj) ? "pi" : Mio_GateReadName((Mio_Gate_t *)pObj->pData), 
        Abc_ObjFanoutNum(pObj), 
        Abc_SclCountBufferFanouts(pObj), 
        Abc_SclCountNonBufferFanouts(pObj) );
    for ( ; i < 4; i++ )
        printf( "    " );
    printf( "a =%5.2f  ",      Abc_ObjIsPi(pObj) ? 0 : Abc_SclObjCell(pObj)->area );
    printf( "d = (" );
    printf( "%6.0f ps; ",      Abc_SclObjTimeOne(p, pObj, 1) );
    printf( "%6.0f ps)  ",     Abc_SclObjTimeOne(p, pObj, 0) );
    printf( "l =%5.0f ff  ",   Abc_SclObjLoadMax(p, pObj) );
    printf( "s =%5.0f ps   ",  Abc_SclObjSlewMax(p, pObj) );
    printf( "sl =%5.0f ps   ", Abc_SclObjSlackMax(p, pObj, p->MaxDelay0) );
    if ( nOffset == 0 )
    {
    printf( "L =%5.0f ff   ",  Abc_SclCountNonBufferLoad(p, pObj) );
    printf( "Lx =%5.0f ff  ",  100.0*Abc_SclCountNonBufferLoad(p, pObj)/p->EstLoadAve );
    printf( "Dx =%5.0f ps  ",  Abc_SclCountNonBufferDelay(p, pObj)/Abc_SclCountNonBufferFanouts(pObj) - Abc_SclObjTimeOne(p, pObj, 1) );
    printf( "Cx =%5.0f ps",    (Abc_SclCountNonBufferDelay(p, pObj)/Abc_SclCountNonBufferFanouts(pObj) - Abc_SclObjTimeOne(p, pObj, 1))/log(Abc_SclCountNonBufferLoad(p, pObj)/p->EstLoadAve) );
    }
    printf( "\n" );
}